

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.cpp
# Opt level: O0

bool __thiscall
de::cmdline::detail::Parser::parse
          (Parser *this,int numArgs,char **args,CommandLine *dst,ostream *err)

{
  char *pcVar1;
  int iVar2;
  OptSet *pOVar3;
  byte bVar4;
  bool bVar5;
  reference pOVar6;
  mapped_type *ppOVar7;
  size_t sVar8;
  char *__end;
  pointer ppVar9;
  ostream *poVar10;
  ValueType *pVVar11;
  bool bVar12;
  pair<std::_Rb_tree_const_iterator<const_de::cmdline::detail::Parser::OptInfo_*>,_bool> pVar13;
  exception *local_348;
  exception *local_340;
  bool local_331;
  OptInfo *local_2e8;
  size_t *local_2b8;
  allocator<char> local_241;
  value_type local_240;
  exception *e;
  char *value;
  _Rb_tree_const_iterator<const_de::cmdline::detail::Parser::OptInfo_*> _Stack_208;
  bool hasValue;
  undefined1 local_200;
  _Self local_1f8;
  _Self local_1f0;
  _Self local_1e8;
  OptInfo *local_1e0;
  OptInfo *opt_1;
  key_type local_1d0;
  _Self local_1b0;
  const_iterator optPos;
  OptMap *optMap;
  bool hasImmValue;
  char *pcStack_198;
  char *nameEnd;
  char *nameStart;
  undefined1 local_180 [6];
  bool isLongName;
  int local_160;
  int local_15c;
  int optNdx;
  int argLen;
  char *arg;
  __normal_iterator<const_de::cmdline::detail::Parser::OptInfo_*,_std::vector<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>_>
  _Stack_148;
  int argNdx;
  allocator<char> local_139;
  key_type local_138;
  allocator<char> local_101;
  key_type local_100;
  reference local_e0;
  OptInfo *opt;
  __normal_iterator<const_de::cmdline::detail::Parser::OptInfo_*,_std::vector<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>_>
  local_d0;
  const_iterator optIter;
  undefined1 local_c0 [7];
  bool allOk;
  OptSet seenOpts;
  OptMap longOptMap;
  OptMap shortOptMap;
  ostream *err_local;
  CommandLine *dst_local;
  char **args_local;
  int numArgs_local;
  Parser *this_local;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>_>
         *)&longOptMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>_>
         *)&seenOpts._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  set<const_de::cmdline::detail::Parser::OptInfo_*,_std::less<const_de::cmdline::detail::Parser::OptInfo_*>,_std::allocator<const_de::cmdline::detail::Parser::OptInfo_*>_>
  ::set((set<const_de::cmdline::detail::Parser::OptInfo_*,_std::less<const_de::cmdline::detail::Parser::OptInfo_*>,_std::allocator<const_de::cmdline::detail::Parser::OptInfo_*>_>
         *)local_c0);
  optIter._M_current._7_1_ = 1;
  local_d0._M_current =
       (OptInfo *)
       std::
       vector<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
       ::begin(&this->m_options);
  while( true ) {
    opt = (OptInfo *)
          std::
          vector<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
          ::end(&this->m_options);
    bVar5 = __gnu_cxx::operator!=
                      (&local_d0,
                       (__normal_iterator<const_de::cmdline::detail::Parser::OptInfo_*,_std::vector<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>_>
                        *)&opt);
    if (!bVar5) break;
    pOVar6 = __gnu_cxx::
             __normal_iterator<const_de::cmdline::detail::Parser::OptInfo_*,_std::vector<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>_>
             ::operator*(&local_d0);
    local_e0 = pOVar6;
    if (pOVar6->shortName != (char *)0x0) {
      pcVar1 = pOVar6->shortName;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,pcVar1,&local_101);
      ppOVar7 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>_>
                              *)&longOptMap._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             &local_100);
      *ppOVar7 = pOVar6;
      std::__cxx11::string::~string((string *)&local_100);
      std::allocator<char>::~allocator(&local_101);
    }
    pOVar6 = local_e0;
    if (local_e0->longName != (char *)0x0) {
      pcVar1 = local_e0->longName;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,pcVar1,&local_139);
      ppOVar7 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>_>
                              *)&seenOpts._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             &local_138);
      *ppOVar7 = pOVar6;
      std::__cxx11::string::~string((string *)&local_138);
      std::allocator<char>::~allocator(&local_139);
    }
    if (local_e0->defaultValue == (char *)0x0) {
      if (local_e0->setDefault != (SetDefaultFunc)0x0) {
        (*local_e0->setDefault)(&dst->m_options);
      }
    }
    else {
      (*local_e0->dispatchParse)(local_e0,local_e0->defaultValue,&dst->m_options);
    }
    _Stack_148 = __gnu_cxx::
                 __normal_iterator<const_de::cmdline::detail::Parser::OptInfo_*,_std::vector<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>_>
                 ::operator++(&local_d0,0);
  }
  for (arg._4_4_ = 0; arg._4_4_ < numArgs; arg._4_4_ = arg._4_4_ + 1) {
    _optNdx = args[arg._4_4_];
    sVar8 = strlen(_optNdx);
    pcVar1 = _optNdx;
    local_15c = (int)sVar8;
    if (((*_optNdx == '-') && (_optNdx[1] == '-')) && (iVar2 = arg._4_4_, _optNdx[2] == '\0'))
    goto LAB_0297f7a3;
    if (*_optNdx == '-') {
      nameStart._6_1_ = _optNdx[1] == '-';
      nameEnd = _optNdx + (ulong)nameStart._6_1_ + 1;
      optMap._7_1_ = 0x3d;
      __end = std::find<char_const*,char>(nameEnd,_optNdx + local_15c,(char *)((long)&optMap + 7));
      pcVar1 = nameEnd;
      optMap._6_1_ = __end != _optNdx + local_15c;
      if ((nameStart._6_1_ & 1) == 0) {
        pOVar3 = (OptSet *)&longOptMap;
      }
      else {
        pOVar3 = &seenOpts;
      }
      local_2b8 = &(pOVar3->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
      optPos._M_node = (_Base_ptr)local_2b8;
      pcStack_198 = __end;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<char_const*,void>
                ((string *)&local_1d0,pcVar1,__end,(allocator<char> *)((long)&opt_1 + 7));
      local_1b0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>_>
           ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>_>
                   *)local_2b8,&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&opt_1 + 7));
      local_1e8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>_>
           ::end(optPos._M_node);
      bVar5 = std::operator!=(&local_1b0,&local_1e8);
      if (bVar5) {
        ppVar9 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>
                 ::operator->(&local_1b0);
        local_2e8 = ppVar9->second;
      }
      else {
        local_2e8 = (OptInfo *)0x0;
      }
      local_1e0 = local_2e8;
      if (local_2e8 == (OptInfo *)0x0) {
        poVar10 = std::operator<<(err,"Unrecognized command line option \'");
        poVar10 = std::operator<<(poVar10,_optNdx);
        std::operator<<(poVar10,"\'\n");
        optIter._M_current._7_1_ = 0;
      }
      else {
        local_1f0._M_node =
             (_Base_ptr)
             std::
             set<const_de::cmdline::detail::Parser::OptInfo_*,_std::less<const_de::cmdline::detail::Parser::OptInfo_*>,_std::allocator<const_de::cmdline::detail::Parser::OptInfo_*>_>
             ::find((set<const_de::cmdline::detail::Parser::OptInfo_*,_std::less<const_de::cmdline::detail::Parser::OptInfo_*>,_std::allocator<const_de::cmdline::detail::Parser::OptInfo_*>_>
                     *)local_c0,&local_1e0);
        local_1f8._M_node =
             (_Base_ptr)
             std::
             set<const_de::cmdline::detail::Parser::OptInfo_*,_std::less<const_de::cmdline::detail::Parser::OptInfo_*>,_std::allocator<const_de::cmdline::detail::Parser::OptInfo_*>_>
             ::end((set<const_de::cmdline::detail::Parser::OptInfo_*,_std::less<const_de::cmdline::detail::Parser::OptInfo_*>,_std::allocator<const_de::cmdline::detail::Parser::OptInfo_*>_>
                    *)local_c0);
        bVar5 = std::operator!=(&local_1f0,&local_1f8);
        if (bVar5) {
          poVar10 = std::operator<<(err,"Command line option \'--");
          poVar10 = std::operator<<(poVar10,local_1e0->longName);
          std::operator<<(poVar10,"\' specified multiple times\n");
          optIter._M_current._7_1_ = 0;
        }
        else {
          pVar13 = std::
                   set<const_de::cmdline::detail::Parser::OptInfo_*,_std::less<const_de::cmdline::detail::Parser::OptInfo_*>,_std::allocator<const_de::cmdline::detail::Parser::OptInfo_*>_>
                   ::insert((set<const_de::cmdline::detail::Parser::OptInfo_*,_std::less<const_de::cmdline::detail::Parser::OptInfo_*>,_std::allocator<const_de::cmdline::detail::Parser::OptInfo_*>_>
                             *)local_c0,&local_1e0);
          _Stack_208 = pVar13.first._M_node;
          local_200 = pVar13.second;
          if ((local_1e0->isFlag & 1U) == 0) {
            bVar12 = (optMap._6_1_ & 1) != 0;
            bVar5 = arg._4_4_ + 1 < numArgs;
            local_331 = bVar12 || bVar5;
            value._7_1_ = local_331;
            if (bVar12 || bVar5) {
              if (bVar12 || bVar5) {
                if ((optMap._6_1_ & 1) == 0) {
                  local_340 = (exception *)args[arg._4_4_ + 1];
                }
                else {
                  local_340 = (exception *)(pcStack_198 + 1);
                }
                local_348 = local_340;
              }
              else {
                local_348 = (exception *)0x0;
              }
              e = local_348;
              if ((optMap._6_1_ & 1) == 0) {
                arg._4_4_ = arg._4_4_ + 1;
              }
              (*local_1e0->dispatchParse)(local_1e0,(char *)local_348,&dst->m_options);
            }
            else {
              poVar10 = std::operator<<(err,"Expected value for command line option \'--");
              poVar10 = std::operator<<(poVar10,local_1e0->longName);
              std::operator<<(poVar10,"\'\n");
              optIter._M_current._7_1_ = 0;
            }
          }
          else if ((optMap._6_1_ & 1) == 0) {
            (*local_1e0->dispatchParse)(local_1e0,(char *)0x0,&dst->m_options);
          }
          else {
            poVar10 = std::operator<<(err,"No value expected for command line option \'--");
            poVar10 = std::operator<<(poVar10,local_1e0->longName);
            std::operator<<(poVar10,"\'\n");
            optIter._M_current._7_1_ = 0;
          }
        }
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,pcVar1,&local_241);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&dst->m_args,&local_240);
      std::__cxx11::string::~string((string *)&local_240);
      std::allocator<char>::~allocator(&local_241);
    }
  }
LAB_0297ff95:
  pVVar11 = TypedFieldMap::get<de::cmdline::(anonymous_namespace)::Help>(&dst->m_options);
  if ((*pVVar11 & 1U) != 0) {
    optIter._M_current._7_1_ = 0;
  }
  bVar4 = optIter._M_current._7_1_;
  std::
  set<const_de::cmdline::detail::Parser::OptInfo_*,_std::less<const_de::cmdline::detail::Parser::OptInfo_*>,_std::allocator<const_de::cmdline::detail::Parser::OptInfo_*>_>
  ::~set((set<const_de::cmdline::detail::Parser::OptInfo_*,_std::less<const_de::cmdline::detail::Parser::OptInfo_*>,_std::allocator<const_de::cmdline::detail::Parser::OptInfo_*>_>
          *)local_c0);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>_>
          *)&seenOpts._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>_>
          *)&longOptMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return (bool)(bVar4 & 1);
LAB_0297f7a3:
  while (local_160 = iVar2 + 1, local_160 < numArgs) {
    pcVar1 = args[local_160];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_180,pcVar1,(allocator<char> *)((long)&nameStart + 7));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&dst->m_args,(value_type *)local_180);
    std::__cxx11::string::~string((string *)local_180);
    std::allocator<char>::~allocator((allocator<char> *)((long)&nameStart + 7));
    iVar2 = local_160;
  }
  goto LAB_0297ff95;
}

Assistant:

bool Parser::parse (int numArgs, const char* const* args, CommandLine* dst, std::ostream& err) const
{
	typedef map<string, const OptInfo*> OptMap;
	typedef set<const OptInfo*> OptSet;

	OptMap	shortOptMap;
	OptMap	longOptMap;
	OptSet	seenOpts;
	bool	allOk			= true;

	DE_ASSERT(dst->m_args.empty() && dst->m_options.empty());

	for (vector<OptInfo>::const_iterator optIter = m_options.begin(); optIter != m_options.end(); optIter++)
	{
		const OptInfo& opt = *optIter;

		DE_ASSERT(opt.shortName || opt.longName);

		if (opt.shortName)
		{
			DE_ASSERT(shortOptMap.find(opt.shortName) == shortOptMap.end());
			shortOptMap[opt.shortName] = &opt;
		}

		if (opt.longName)
		{
			DE_ASSERT(longOptMap.find(opt.longName) == longOptMap.end());
			longOptMap[opt.longName] = &opt;
		}

		// Set default values.
		if (opt.defaultValue)
			opt.dispatchParse(&opt, opt.defaultValue, &dst->m_options);
		else if (opt.setDefault)
			opt.setDefault(&dst->m_options);
	}

	DE_ASSERT(!dst->m_options.get<Help>());

	for (int argNdx = 0; argNdx < numArgs; argNdx++)
	{
		const char*		arg		= args[argNdx];
		int				argLen	= (int)strlen(arg);

		if (arg[0] == '-' && arg[1] == '-' && arg[2] == 0)
		{
			// End of option list (--)
			for (int optNdx = argNdx+1; optNdx < numArgs; optNdx++)
				dst->m_args.push_back(args[optNdx]);
			break;
		}
		else if (arg[0] == '-')
		{
			const bool				isLongName	= arg[1] == '-';
			const char*				nameStart	= arg + (isLongName ? 2 : 1);
			const char*				nameEnd		= std::find(nameStart, arg+argLen, '=');
			const bool				hasImmValue	= nameEnd != (arg+argLen);
			const OptMap&			optMap		= isLongName ? longOptMap : shortOptMap;
			OptMap::const_iterator	optPos		= optMap.find(string(nameStart, nameEnd));
			const OptInfo*			opt			= optPos != optMap.end() ? optPos->second : DE_NULL;

			if (!opt)
			{
				err << "Unrecognized command line option '" << arg << "'\n";
				allOk = false;
				continue;
			}

			if (seenOpts.find(opt) != seenOpts.end())
			{
				err << "Command line option '--" << opt->longName << "' specified multiple times\n";
				allOk = false;
				continue;
			}

			seenOpts.insert(opt);

			if (opt->isFlag)
			{
				if (!hasImmValue)
				{
					opt->dispatchParse(opt, DE_NULL, &dst->m_options);
				}
				else
				{
					err << "No value expected for command line option '--" << opt->longName << "'\n";
					allOk = false;
				}
			}
			else
			{
				const bool	hasValue	= hasImmValue || (argNdx+1 < numArgs);

				if (hasValue)
				{
					const char*	value	= hasValue ? (hasImmValue ? nameEnd+1 : args[argNdx+1]) : DE_NULL;

					if (!hasImmValue)
						argNdx += 1; // Skip value

					try
					{
						opt->dispatchParse(opt, value, &dst->m_options);
					}
					catch (const std::exception& e)
					{
						err << "Got error parsing command line option '--" << opt->longName << "': " << e.what() << "\n";
						allOk = false;
					}
				}
				else
				{
					err << "Expected value for command line option '--" << opt->longName << "'\n";
					allOk = false;
				}
			}
		}
		else
		{
			// Not an option
			dst->m_args.push_back(arg);
		}
	}

	// Help specified?
	if (dst->m_options.get<Help>())
		allOk = false;

	return allOk;
}